

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

void __thiscall
chaiscript::Type_Conversions::add_conversion
          (Type_Conversions *this,shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  const_iterator cVar9;
  undefined8 *puVar10;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  type_info *local_20;
  type_info *local_18;
  
  Catch::clara::std::unique_lock<std::shared_mutex>::unique_lock(&l,&this->m_mutex);
  peVar1 = (conversion->
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  cVar9 = find_bidir(this,&peVar1->m_to,&peVar1->m_from);
  if ((_Rb_tree_header *)cVar9._M_node == &(this->m_conversions)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
    ::_M_insert_unique<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&>
              ((_Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
                *)&this->m_conversions,conversion);
    peVar1 = (conversion->
             super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_20 = (peVar1->m_to).m_bare_type_info;
    local_18 = (peVar1->m_from).m_bare_type_info;
    std::
    _Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
    ::_M_insert_range_unique<std::type_info_const*const*>
              ((_Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
                *)&this->m_convertableTypes,&local_20,(type_info **)&stack0xfffffffffffffff0);
    LOCK();
    (this->m_num_types).super___atomic_base<unsigned_long>._M_i =
         (this->m_convertableTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    UNLOCK();
    Catch::clara::std::unique_lock<std::shared_mutex>::~unique_lock(&l);
    return;
  }
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x50);
  peVar1 = (conversion->
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  ptVar2 = (peVar1->m_to).m_type_info;
  ptVar3 = (peVar1->m_to).m_bare_type_info;
  uVar4 = *(undefined8 *)&(peVar1->m_to).m_flags;
  uVar5 = *(undefined4 *)&(peVar1->m_from).m_type_info;
  uVar6 = *(undefined4 *)((long)&(peVar1->m_from).m_type_info + 4);
  uVar7 = *(undefined4 *)&(peVar1->m_from).m_bare_type_info;
  uVar8 = *(undefined4 *)((long)&(peVar1->m_from).m_bare_type_info + 4);
  puVar10[3] = *(undefined8 *)&(peVar1->m_from).m_flags;
  *(undefined4 *)(puVar10 + 1) = uVar5;
  *(undefined4 *)((long)puVar10 + 0xc) = uVar6;
  *(undefined4 *)(puVar10 + 2) = uVar7;
  *(undefined4 *)((long)puVar10 + 0x14) = uVar8;
  puVar10[4] = ptVar3;
  puVar10[5] = 0x2b;
  puVar10[6] = "Trying to re-insert an existing conversion!";
  *puVar10 = &PTR__bad_cast_00697bf0;
  puVar10[7] = ptVar2;
  puVar10[8] = ptVar3;
  puVar10[9] = uVar4;
  __cxa_throw(puVar10,&exception::conversion_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

void add_conversion(const std::shared_ptr<detail::Type_Conversion_Base> &conversion) {
      chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
      if (find_bidir(conversion->to(), conversion->from()) != m_conversions.end()) {
        throw exception::conversion_error(conversion->to(), conversion->from(), "Trying to re-insert an existing conversion!");
      }
      m_conversions.insert(conversion);
      m_convertableTypes.insert({conversion->to().bare_type_info(), conversion->from().bare_type_info()});
      m_num_types = m_convertableTypes.size();
    }